

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::CompressionParameters> *
kj::_::validateCompressionConfig
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,UnverifiedConfig *config,
          bool isAgreement)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined7 in_register_00000011;
  ArrayPtr<const_char> *pAVar4;
  ArrayPtr<const_char> *extraout_RDX;
  undefined1 local_78 [16];
  CompressionParameters local_68;
  Array<char> local_40;
  
  pAVar4 = (ArrayPtr<const_char> *)CONCAT71(in_register_00000011,isAgreement);
  local_68.outboundMaxWindowBits.ptr.isSet = false;
  local_68.inboundMaxWindowBits.ptr.isSet = false;
  if ((config->serverMaxWindowBits).ptr.isSet == true) {
    if ((config->serverMaxWindowBits).ptr.field_1.value.size_ == 0) goto LAB_0036409b;
    str<kj::ArrayPtr<char_const>&>
              ((String *)&local_40,(kj *)&(config->serverMaxWindowBits).ptr.field_1.value,pAVar4);
    String::tryParseAs<unsigned_long>((String *)local_78);
    uVar3 = local_78._8_8_;
    bVar2 = local_78[0];
    aVar1.value = local_78._8_8_;
    Array<char>::~Array(&local_40);
    if ((bVar2 & (uVar3 & 0xfffffffffffffff8) == 8) == 0) goto LAB_0036409b;
    pAVar4 = extraout_RDX;
    if (isAgreement) {
      local_68.inboundMaxWindowBits.ptr.field_1.value = uVar3;
      local_68.inboundMaxWindowBits.ptr.isSet = true;
      if ((config->clientMaxWindowBits).ptr.isSet == false) goto LAB_00364085;
      if ((config->clientMaxWindowBits).ptr.field_1.value.size_ == 0) goto LAB_0036409b;
    }
    else {
      local_68.outboundMaxWindowBits.ptr.field_1.value = uVar3;
      local_68.outboundMaxWindowBits.ptr.isSet = true;
      if ((config->clientMaxWindowBits).ptr.isSet == false) goto LAB_003640ca;
      if ((config->clientMaxWindowBits).ptr.field_1.value.size_ == 0) goto LAB_003640bc;
    }
LAB_0036402e:
    str<kj::ArrayPtr<char_const>&>
              ((String *)&local_40,(kj *)&(config->clientMaxWindowBits).ptr.field_1.value,pAVar4);
    String::tryParseAs<unsigned_long>((String *)local_78);
    Array<char>::~Array(&local_40);
    if ((local_78[0] & (local_78._8_8_ & 0xfffffffffffffff8) == 8) == 0) {
LAB_0036409b:
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    if (isAgreement) {
      local_68.outboundMaxWindowBits.ptr.field_1.value = local_78._8_8_;
      local_68.outboundMaxWindowBits.ptr.isSet = true;
LAB_00364085:
      local_68.outboundNoContextTakeover = config->clientNoContextTakeover;
      local_68.inboundNoContextTakeover = config->serverNoContextTakeover;
      goto LAB_003640d9;
    }
LAB_003640c0:
    local_68.inboundMaxWindowBits.ptr.isSet = true;
    local_68.inboundMaxWindowBits.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)local_78._8_8_;
  }
  else {
    if ((config->clientMaxWindowBits).ptr.isSet != false) {
      if ((config->clientMaxWindowBits).ptr.field_1.value.size_ != 0) goto LAB_0036402e;
      if (isAgreement) goto LAB_0036409b;
LAB_003640bc:
      local_78._8_8_ = 0xf;
      goto LAB_003640c0;
    }
    if (isAgreement) goto LAB_00364085;
  }
LAB_003640ca:
  local_68.inboundNoContextTakeover = config->clientNoContextTakeover;
  local_68.outboundNoContextTakeover = config->serverNoContextTakeover;
LAB_003640d9:
  NullableValue<kj::CompressionParameters>::NullableValue(&__return_storage_ptr__->ptr,&local_68);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> validateCompressionConfig(UnverifiedConfig&& config,
    bool isAgreement) {
  // Verifies that the `config` is valid depending on whether we're validating a Request (offer) or
  // a Response (agreement). This essentially consumes the `UnverifiedConfig` and converts it into a
  // `CompressionParameters` struct.
  CompressionParameters result;

  KJ_IF_SOME(serverBits, config.serverMaxWindowBits) {
    if (serverBits.size() == 0) {
      // This means `server_max_window_bits` was passed without a value. Since a value is required,
      // this config is invalid.
      return kj::none;
    } else {
      KJ_IF_SOME(bits, kj::str(serverBits).tryParseAs<size_t>()) {
        if (bits < 8 || 15 < bits) {
          // Out of range -- invalid.
          return kj::none;
        }
        if (isAgreement) {
          result.inboundMaxWindowBits = bits;
        } else {
          result.outboundMaxWindowBits = bits;
        }
      } else {
        // Invalid ABNF, expected 1*DIGIT.
        return kj::none;
      }
    }
  }